

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

Float __thiscall pbrt::PortalImageInfiniteLight::Area(PortalImageInfiniteLight *this)

{
  long in_RDI;
  array<pbrt::Point3<float>,_4> *this_00;
  type tVar1;
  type tVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [64];
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  Vector3<float> VVar6;
  Point3<float> *this_01;
  undefined1 auVar5 [56];
  
  auVar5 = in_ZMM0._8_56_;
  this_00 = (array<pbrt::Point3<float>,_4> *)(in_RDI + 0x200);
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_00,1);
  this_01 = (Point3<float> *)0x0;
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_00,0);
  VVar6 = Point3<float>::operator-(this_01,this_00->values);
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  vmovlpd_avx(auVar3._0_16_);
  tVar1 = Length<float>((Vector3<float> *)0x705a51);
  auVar5 = extraout_var;
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_00,3);
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_00,(size_t)this_01);
  VVar6 = Point3<float>::operator-(this_01,this_00->values);
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  vmovlpd_avx(auVar4._0_16_);
  tVar2 = Length<float>((Vector3<float> *)0x705aaf);
  return tVar1 * tVar2;
}

Assistant:

PBRT_CPU_GPU
    Float Area() const {
        return Length(portal[1] - portal[0]) * Length(portal[3] - portal[0]);
    }